

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_deny(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  char *pcVar5;
  char buf [4608];
  char arg [4608];
  char query [4608];
  char acStack_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  one_argument(argument,local_2428);
  if (local_2428[0] == '\0') {
    pcVar5 = "Deny whom?\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_2428);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "They aren\'t here.\n\r";
    }
    else {
      bVar2 = is_npc(ch_00);
      if (bVar2) {
        pcVar5 = "Not on NPC\'s.\n\r";
      }
      else {
        iVar3 = get_trust(ch_00);
        iVar4 = get_trust(ch);
        if (iVar3 < iVar4) {
          pbVar1 = (byte *)((long)ch_00->act + 2);
          *pbVar1 = *pbVar1 | 0x80;
          send_to_char("You are denied access!\n\r",ch_00);
          sprintf(acStack_3628,"$N denies access to %s",ch_00->name);
          wiznet(acStack_3628,ch,(OBJ_DATA *)0x0,9,0xc,0);
          send_to_char("OK.\n\r",ch);
          save_char_obj(ch_00);
          stop_fighting(ch_00,true);
          ch_00->pause = 0;
          if (ch_00->desc != (DESCRIPTOR_DATA *)0x0) {
            sprintf(local_1228,
                    "UPDATE sitetracker SET denials=denials+1 WHERE \'%s\' RLIKE site_name",
                    ch_00->desc->host);
            one_query(local_1228);
          }
          sprintf(acStack_3628,"AUTO: Denied by %s.\n\r",ch->true_name);
          add_history((CHAR_DATA *)0x0,ch_00,acStack_3628);
          pcVar5 = palloc_string(ch_00->true_name);
          do_quit_new(ch_00,"",true);
          delete_char(pcVar5,true);
          return;
        }
        pcVar5 = "You failed.\n\r";
      }
    }
  }
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_deny(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH], *cname;
	char query[MSL];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Deny whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	SET_BIT(victim->act, PLR_DENY);

	send_to_char("You are denied access!\n\r", victim);

	sprintf(buf, "$N denies access to %s", victim->name);
	wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);

	send_to_char("OK.\n\r", ch);

	save_char_obj(victim);

	stop_fighting(victim, true);

	victim->pause = 0;

	// add to denial #
	if (victim->desc)
	{
		sprintf(query, "UPDATE sitetracker SET denials=denials+1 WHERE '%s' RLIKE site_name", victim->desc->host);
		one_query(query);
	}

	sprintf(buf, "AUTO: Denied by %s.\n\r", ch->true_name);
	add_history(nullptr, victim, buf);

	cname = palloc_string(victim->true_name);

	do_quit_new(victim, "", true);
	delete_char(cname, true);
}